

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

void __thiscall dg::pta::PointerAnalysis::~PointerAnalysis(PointerAnalysis *this)

{
  this->_vptr_PointerAnalysis = (_func_int **)&PTR__PointerAnalysis_001408d8;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::~_Rb_tree(&(this->options).super_AnalysisOptions.allocationFunctions._M_t);
  std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base
            (&(this->changed).
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>);
  std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base
            (&(this->to_process).
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>);
  return;
}

Assistant:

virtual ~PointerAnalysis() = default;